

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Rational * __thiscall Matrix<Rational>::trace(Matrix<Rational> *this)

{
  char *pcVar1;
  int *in_RSI;
  Rational *in_RDI;
  uint i;
  Rational *ans;
  Rational *in_stack_000000b8;
  Rational *in_stack_000000c0;
  uint local_24;
  
  if (in_RSI[1] == *in_RSI) {
    Rational::Rational(in_RDI);
    for (local_24 = 0; local_24 < (uint)(in_RSI[1] * in_RSI[1]); local_24 = in_RSI[1] + 1 + local_24
        ) {
      Rational::operator+=(in_stack_000000c0,in_stack_000000b8);
    }
    return in_RDI;
  }
  pcVar1 = (char *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error((matrix_error *)in_RDI,pcVar1);
  __cxa_throw(pcVar1,&matrix_error::typeinfo,matrix_error::~matrix_error);
}

Assistant:

const Field Matrix<Field>::trace() const
{
    if(N != M)
        throw matrix_error("Trying to calculate trace of a non-square matrix");
    Field ans;
    for(unsigned i = 0; i < N * N; i += N + 1)
    {
        ans += arr[i];
    }
    return ans;
}